

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtransaction.cpp
# Opt level: O0

void __thiscall
ConfidentialTransaction_TxOutTest_Test::TestBody(ConfidentialTransaction_TxOutTest_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  reference pvVar4;
  size_type sVar5;
  reference pvVar6;
  Amount extraout_DL;
  Amount extraout_DL_00;
  AssertHelper local_15d8;
  Message local_15d0;
  int local_15c8;
  uint local_15c4;
  undefined1 local_15c0 [8];
  AssertionResult gtest_ar_39;
  Message local_15a8;
  AssertHelper local_15a0;
  Message local_1598 [2];
  CfdException *anon_var_0_2;
  char *pcStack_1580;
  bool gtest_caught_expected_2;
  ConstCharPtr gtest_msg_2;
  Message local_1570;
  ConfidentialValue local_1568;
  string local_1540 [32];
  undefined1 local_1520 [8];
  AssertionResult gtest_ar_38;
  Message local_1508;
  ConfidentialTxOutReference local_1500;
  AssertHelper local_1408;
  Message local_1400;
  undefined8 local_13f8;
  Amount local_13f0;
  undefined8 local_13e8;
  Amount amt2;
  AssertHelper local_13d8;
  Message local_13d0;
  int local_13c4;
  undefined1 local_13c0 [8];
  AssertionResult gtest_ar_37;
  Message local_13a8;
  uint local_139c;
  undefined1 local_1398 [8];
  AssertionResult gtest_ar_36;
  Message local_1380;
  size_type local_1378;
  int local_136c;
  undefined1 local_1368 [8];
  AssertionResult gtest_ar_35;
  Message local_1350;
  vector<unsigned_int,_std::allocator<unsigned_int>_> index_list;
  Message local_1310;
  uint local_1304;
  undefined1 local_1300 [8];
  AssertionResult gtest_ar_34;
  Message local_12e8;
  AssertHelper local_12e0;
  Message local_12d8;
  int local_12d0;
  uint local_12cc;
  undefined1 local_12c8 [8];
  AssertionResult gtest_ar_33;
  Message local_12b0;
  int local_12a4;
  undefined1 local_12a0 [8];
  AssertionResult gtest_ar_32;
  Message local_1288;
  AssertHelper local_1280;
  Message local_1278;
  string local_1270 [32];
  ByteData local_1250;
  string local_1238 [32];
  undefined1 local_1218 [8];
  AssertionResult gtest_ar_31;
  Message local_1200;
  string local_11f8 [32];
  ByteData local_11d8;
  string local_11c0 [32];
  undefined1 local_11a0 [8];
  AssertionResult gtest_ar_30;
  Message local_1188;
  ConfidentialNonce local_1180;
  string local_1158 [32];
  undefined1 local_1138 [8];
  AssertionResult gtest_ar_29;
  Message local_1120;
  string local_1118 [32];
  Script local_10f8;
  string local_10c0 [32];
  undefined1 local_10a0 [8];
  AssertionResult gtest_ar_28;
  Message local_1088;
  ConfidentialValue local_1080;
  string local_1058 [32];
  undefined1 local_1038 [8];
  AssertionResult gtest_ar_27;
  Message local_1020;
  ConfidentialAssetId local_1018;
  string local_ff0 [32];
  undefined1 local_fd0 [8];
  AssertionResult gtest_ar_26;
  Message local_fb8;
  ByteData local_fb0;
  string local_f98 [32];
  undefined1 local_f78 [8];
  AssertionResult gtest_ar_25;
  Message local_f60;
  ByteData local_f58;
  string local_f40 [32];
  undefined1 local_f20 [8];
  AssertionResult gtest_ar_24;
  Message local_f08;
  ConfidentialNonce local_f00;
  string local_ed8 [32];
  undefined1 local_eb8 [8];
  AssertionResult gtest_ar_23;
  Message local_ea0;
  string local_e98 [32];
  Script local_e78;
  string local_e40 [32];
  undefined1 local_e20 [8];
  AssertionResult gtest_ar_22;
  Message local_e08;
  ConfidentialValue local_e00;
  string local_dd8 [32];
  undefined1 local_db8 [8];
  AssertionResult gtest_ar_21;
  Message local_da0;
  ConfidentialAssetId local_d98;
  string local_d70 [32];
  undefined1 local_d50 [8];
  AssertionResult gtest_ar_20;
  Message local_d38;
  int local_d2c;
  size_type local_d28;
  undefined1 local_d20 [8];
  AssertionResult gtest_ar_19;
  Message local_d08;
  vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
  local_d00;
  undefined1 local_ce8 [8];
  vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
  txout_list;
  Message local_cc8;
  undefined1 local_cc0 [8];
  AssertionResult gtest_ar_18;
  Message local_ca8;
  AssertHelper local_ca0;
  Message local_c98;
  string local_c90 [32];
  ByteData local_c70;
  string local_c58 [32];
  undefined1 local_c38 [8];
  AssertionResult gtest_ar_17;
  Message local_c20;
  string local_c18 [32];
  ByteData local_bf8;
  string local_be0 [32];
  undefined1 local_bc0 [8];
  AssertionResult gtest_ar_16;
  Message local_ba8;
  ConfidentialNonce local_ba0;
  string local_b78 [32];
  undefined1 local_b58 [8];
  AssertionResult gtest_ar_15;
  Message local_b40;
  string local_b38 [32];
  Script local_b18;
  string local_ae0 [32];
  undefined1 local_ac0 [8];
  AssertionResult gtest_ar_14;
  Message local_aa8;
  ConfidentialValue local_aa0;
  string local_a78 [32];
  undefined1 local_a58 [8];
  AssertionResult gtest_ar_13;
  Message local_a40;
  ConfidentialAssetId local_a38;
  string local_a10 [32];
  undefined1 local_9f0 [8];
  AssertionResult gtest_ar_12;
  Message local_9d8;
  ConfidentialTxOutReference local_9d0;
  AssertHelper local_8d8;
  Message local_8d0;
  int local_8c8;
  uint local_8c4;
  undefined1 local_8c0 [8];
  AssertionResult gtest_ar_11;
  Message local_8a8;
  int local_89c;
  undefined1 local_898 [8];
  AssertionResult gtest_ar_10;
  Message local_880;
  allocator local_871;
  string local_870 [32];
  undefined1 local_850 [8];
  ByteData range_proof;
  string local_830 [32];
  undefined1 local_810 [8];
  ByteData surjection_proof;
  string local_7f0 [32];
  undefined1 local_7d0 [8];
  ConfidentialNonce nonce;
  string local_7a0 [32];
  undefined1 local_780 [8];
  Script exp_locking_script2;
  Message local_740;
  ByteData local_738;
  string local_720 [32];
  undefined1 local_700 [8];
  AssertionResult gtest_ar_9;
  Message local_6e8;
  ByteData local_6e0;
  string local_6c8 [32];
  undefined1 local_6a8 [8];
  AssertionResult gtest_ar_8;
  Message local_690;
  ConfidentialNonce local_688;
  string local_660 [32];
  undefined1 local_640 [8];
  AssertionResult gtest_ar_7;
  Message local_628;
  string local_620 [32];
  Script local_600;
  string local_5c8 [32];
  undefined1 local_5a8 [8];
  AssertionResult gtest_ar_6;
  Message local_590;
  ConfidentialValue local_588;
  string local_560 [32];
  undefined1 local_540 [8];
  AssertionResult gtest_ar_5;
  Message local_528;
  ConfidentialAssetId local_520;
  string local_4f8 [32];
  undefined1 local_4d8 [8];
  AssertionResult gtest_ar_4;
  Message local_4c0;
  ConfidentialTxOutReference local_4b8;
  AssertHelper local_3c0;
  Message local_3b8 [2];
  CfdException *anon_var_0_1;
  byte local_2a9;
  char *pcStack_2a8;
  bool gtest_caught_expected_1;
  ConstCharPtr gtest_msg_1;
  Message local_298;
  undefined1 local_290 [8];
  AssertionResult gtest_ar_3;
  Message local_278;
  AssertHelper local_270;
  Message local_268;
  int local_260;
  uint local_25c;
  undefined1 local_258 [8];
  AssertionResult gtest_ar_2;
  Message local_240;
  int local_234;
  undefined1 local_230 [8];
  AssertionResult gtest_ar_1;
  Message local_218;
  undefined1 local_210 [8];
  ConfidentialTxOutReference txout_ref;
  ConfidentialAssetId asset;
  undefined1 local_e0 [8];
  Amount amt;
  AssertHelper local_d0;
  Message local_c8 [2];
  CfdException *anon_var_0;
  char *pcStack_b0;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  int64_t exp_satoshi;
  Message local_98;
  int local_90;
  uint local_8c;
  undefined1 local_88 [8];
  AssertionResult gtest_ar;
  Message local_70 [3];
  uint local_58;
  uint local_54;
  uint32_t get_index;
  uint32_t index;
  ConfidentialTransaction tx;
  ConfidentialTransaction_TxOutTest_Test *this_local;
  
  cfd::core::ConfidentialTransaction::ConfidentialTransaction
            ((ConfidentialTransaction *)&get_index,(string *)&exp_tx_empty_hex_abi_cxx11_);
  local_54 = 0;
  local_58 = 0;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_54 = cfd::core::ConfidentialTransaction::AddTxIn
                           ((Txid *)&get_index,0x67c088,2,(Script *)0xfffffffe);
    }
  }
  else {
    testing::Message::Message(local_70);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x26a,
               "Expected: (index = tx.AddTxIn(exp_txid, exp_index, exp_sequence)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar.message_,local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    testing::Message::~Message(local_70);
  }
  local_8c = cfd::core::ConfidentialTransaction::GetTxOutCount();
  local_90 = 0;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            ((EqHelper<false> *)local_88,"tx.GetTxOutCount()","0",&local_8c,&local_90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
  if (!bVar1) {
    testing::Message::Message(&local_98);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_88);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&exp_satoshi,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x26d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&exp_satoshi,&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&exp_satoshi);
    testing::Message::~Message(&local_98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
  gtest_msg.value = (char *)0xbc614e;
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xffffffffffffff50,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xffffffffffffff50);
  if (bVar1) {
    anon_var_0._7_1_ = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_58 = cfd::core::ConfidentialTransaction::GetTxOutIndex((Script *)&get_index);
    }
    if ((anon_var_0._7_1_ & 1) == 0) {
      pcStack_b0 = 
      "Expected: (get_index = tx.GetTxOutIndex(exp_locking_script)) throws an exception of type CfdException.\n  Actual: it throws nothing."
      ;
      goto LAB_00445588;
    }
  }
  else {
LAB_00445588:
    testing::Message::Message(local_c8);
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x26f,pcStack_b0);
    testing::internal::AssertHelper::operator=(&local_d0,local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    testing::Message::~Message(local_c8);
  }
  local_e0 = (undefined1  [8])cfd::core::Amount::CreateBySatoshiAmount((long)gtest_msg.value);
  amt = extraout_DL;
  cfd::core::ConfidentialAssetId::ConfidentialAssetId
            ((ConfidentialAssetId *)
             &txout_ref.range_proof_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(string *)&exp_assetid_abi_cxx11_);
  cfd::core::ConfidentialTxOutReference::ConfidentialTxOutReference
            ((ConfidentialTxOutReference *)local_210);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_54 = cfd::core::ConfidentialTransaction::AddTxOut
                           ((Amount *)&get_index,(ConfidentialAssetId *)local_e0,
                            (Script *)
                            &txout_ref.range_proof_.data_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
    }
  }
  else {
    testing::Message::Message(&local_218);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x274,
               "Expected: (index = tx.AddTxOut(amt, asset, exp_locking_script)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_218);
  }
  local_234 = 0;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            ((EqHelper<false> *)local_230,"index","0",&local_54,&local_234);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_230);
  if (!bVar1) {
    testing::Message::Message(&local_240);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_230);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x275,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_240);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_240);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_230);
  local_25c = cfd::core::ConfidentialTransaction::GetTxOutCount();
  local_260 = 1;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            ((EqHelper<false> *)local_258,"tx.GetTxOutCount()","1",&local_25c,&local_260);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_258);
  if (!bVar1) {
    testing::Message::Message(&local_268);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_258);
    testing::internal::AssertHelper::AssertHelper
              (&local_270,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x276,pcVar2);
    testing::internal::AssertHelper::operator=(&local_270,&local_268);
    testing::internal::AssertHelper::~AssertHelper(&local_270);
    testing::Message::~Message(&local_268);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_258);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_58 = cfd::core::ConfidentialTransaction::GetTxOutIndex((Script *)&get_index);
    }
  }
  else {
    testing::Message::Message(&local_278);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x277,
               "Expected: get_index = tx.GetTxOutIndex(exp_locking_script) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_278);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_278);
  }
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
            ((EqHelper<false> *)local_290,"index","get_index",&local_54,&local_58);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_290);
  if (!bVar1) {
    testing::Message::Message(&local_298);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_290);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_msg_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x278,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_msg_1,&local_298);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_msg_1);
    testing::Message::~Message(&local_298);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_290);
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffffd58,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffffd58);
  if (bVar1) {
    local_2a9 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ConfidentialTransaction::GetTxOut((uint)&anon_var_0_1);
      cfd::core::ConfidentialTxOutReference::operator=
                ((ConfidentialTxOutReference *)local_210,(ConfidentialTxOutReference *)&anon_var_0_1
                );
      cfd::core::ConfidentialTxOutReference::~ConfidentialTxOutReference
                ((ConfidentialTxOutReference *)&anon_var_0_1);
    }
    if ((local_2a9 & 1) == 0) {
      pcStack_2a8 = 
      "Expected: (txout_ref = tx.GetTxOut(index + 5)) throws an exception of type CfdException.\n  Actual: it throws nothing."
      ;
      goto LAB_00445dde;
    }
  }
  else {
LAB_00445dde:
    testing::Message::Message(local_3b8);
    testing::internal::AssertHelper::AssertHelper
              (&local_3c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x27a,pcStack_2a8);
    testing::internal::AssertHelper::operator=(&local_3c0,local_3b8);
    testing::internal::AssertHelper::~AssertHelper(&local_3c0);
    testing::Message::~Message(local_3b8);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ConfidentialTransaction::GetTxOut((uint)&local_4b8);
      cfd::core::ConfidentialTxOutReference::operator=
                ((ConfidentialTxOutReference *)local_210,&local_4b8);
      cfd::core::ConfidentialTxOutReference::~ConfidentialTxOutReference(&local_4b8);
    }
  }
  else {
    testing::Message::Message(&local_4c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x27b,
               "Expected: (txout_ref = tx.GetTxOut(index)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_4c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_4c0);
  }
  cfd::core::ConfidentialTxOutReference::GetAsset
            (&local_520,(ConfidentialTxOutReference *)local_210);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_4d8,"txout_ref.GetAsset().GetHex().c_str()",
             "\"6f1a4b6bd5571b5f08ab79c314dc6483f9b952af2f5ef206cd6f8e68eb1186f3\"",pcVar2,
             "6f1a4b6bd5571b5f08ab79c314dc6483f9b952af2f5ef206cd6f8e68eb1186f3");
  std::__cxx11::string::~string(local_4f8);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId(&local_520);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4d8);
  if (!bVar1) {
    testing::Message::Message(&local_528);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x27e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_528);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_528);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4d8);
  cfd::core::ConfidentialTxOutReference::GetConfidentialValue
            (&local_588,(ConfidentialTxOutReference *)local_210);
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_();
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_540,"txout_ref.GetConfidentialValue().GetHex().c_str()",
             "\"010000000000bc614e\"",pcVar2,"010000000000bc614e");
  std::__cxx11::string::~string(local_560);
  cfd::core::ConfidentialValue::~ConfidentialValue(&local_588);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_540);
  if (!bVar1) {
    testing::Message::Message(&local_590);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_540);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x280,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_590);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_590);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_540);
  cfd::core::AbstractTxOutReference::GetLockingScript
            (&local_600,(AbstractTxOutReference *)local_210);
  cfd::core::Script::GetHex_abi_cxx11_();
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cfd::core::Script::GetHex_abi_cxx11_();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_5a8,"txout_ref.GetLockingScript().GetHex().c_str()",
             "exp_locking_script.GetHex().c_str()",pcVar2,pcVar3);
  std::__cxx11::string::~string(local_620);
  std::__cxx11::string::~string(local_5c8);
  cfd::core::Script::~Script(&local_600);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5a8);
  if (!bVar1) {
    testing::Message::Message(&local_628);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_5a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x282,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_628);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_628);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5a8);
  cfd::core::ConfidentialTxOutReference::GetNonce
            (&local_688,(ConfidentialTxOutReference *)local_210);
  cfd::core::ConfidentialNonce::GetHex_abi_cxx11_();
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_640,"txout_ref.GetNonce().GetHex().c_str()","\"\"",pcVar2,"");
  std::__cxx11::string::~string(local_660);
  cfd::core::ConfidentialNonce::~ConfidentialNonce(&local_688);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_640);
  if (!bVar1) {
    testing::Message::Message(&local_690);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_640);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x283,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_690);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_690);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_640);
  cfd::core::ConfidentialTxOutReference::GetSurjectionProof
            (&local_6e0,(ConfidentialTxOutReference *)local_210);
  cfd::core::ByteData::GetHex_abi_cxx11_();
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_6a8,"txout_ref.GetSurjectionProof().GetHex().c_str()","\"\"",pcVar2,
             "");
  std::__cxx11::string::~string(local_6c8);
  cfd::core::ByteData::~ByteData(&local_6e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6a8);
  if (!bVar1) {
    testing::Message::Message(&local_6e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_6a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x284,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_6e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_6e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6a8);
  cfd::core::ConfidentialTxOutReference::GetRangeProof
            (&local_738,(ConfidentialTxOutReference *)local_210);
  cfd::core::ByteData::GetHex_abi_cxx11_();
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_700,"txout_ref.GetRangeProof().GetHex().c_str()","\"\"",pcVar2,"");
  std::__cxx11::string::~string(local_720);
  cfd::core::ByteData::~ByteData(&local_738);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_700);
  if (!bVar1) {
    testing::Message::Message(&local_740);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_700);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &exp_locking_script2.script_stack_.
                super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x285,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &exp_locking_script2.script_stack_.
                super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_740);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &exp_locking_script2.script_stack_.
                super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_740);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_700);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_7a0,"00146a98a3f2935718df72518c00768ec67c589e0b28",(allocator *)&nonce.field_0x27
            );
  cfd::core::Script::Script((Script *)local_780,local_7a0);
  std::__cxx11::string::~string(local_7a0);
  std::allocator<char>::~allocator((allocator<char> *)&nonce.field_0x27);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_7f0,"991a4b6bd5571b5f08ab79c314dc6483f9b952af2f5ef206cd6f8e68eb1186f3",
             (allocator *)
             ((long)&surjection_proof.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::ConfidentialNonce::ConfidentialNonce((ConfidentialNonce *)local_7d0,local_7f0);
  std::__cxx11::string::~string(local_7f0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&surjection_proof.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_830,"1234567890",
             (allocator *)
             ((long)&range_proof.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::ByteData::ByteData((ByteData *)local_810,local_830);
  std::__cxx11::string::~string(local_830);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&range_proof.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_870,"1234567890123456789012345678901234567890",&local_871);
  cfd::core::ByteData::ByteData((ByteData *)local_850,local_870);
  std::__cxx11::string::~string(local_870);
  std::allocator<char>::~allocator((allocator<char> *)&local_871);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_54 = cfd::core::ConfidentialTransaction::AddTxOut
                           ((Amount *)&get_index,(ConfidentialAssetId *)local_e0,
                            (Script *)
                            &txout_ref.range_proof_.data_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,
                            (ConfidentialNonce *)local_780,(ByteData *)local_7d0,
                            (ByteData *)local_810);
    }
  }
  else {
    testing::Message::Message(&local_880);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x28f,
               "Expected: (index = tx.AddTxOut(amt, asset, exp_locking_script2, nonce, surjection_proof, range_proof)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_880);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_880);
  }
  local_89c = 1;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            ((EqHelper<false> *)local_898,"index","1",&local_54,&local_89c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_898);
  if (!bVar1) {
    testing::Message::Message(&local_8a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_898);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x290,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_8a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_8a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_898);
  local_8c4 = cfd::core::ConfidentialTransaction::GetTxOutCount();
  local_8c8 = 2;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            ((EqHelper<false> *)local_8c0,"tx.GetTxOutCount()","2",&local_8c4,&local_8c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8c0);
  if (!bVar1) {
    testing::Message::Message(&local_8d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_8c0);
    testing::internal::AssertHelper::AssertHelper
              (&local_8d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x291,pcVar2);
    testing::internal::AssertHelper::operator=(&local_8d8,&local_8d0);
    testing::internal::AssertHelper::~AssertHelper(&local_8d8);
    testing::Message::~Message(&local_8d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8c0);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ConfidentialTransaction::GetTxOut((uint)&local_9d0);
      cfd::core::ConfidentialTxOutReference::operator=
                ((ConfidentialTxOutReference *)local_210,&local_9d0);
      cfd::core::ConfidentialTxOutReference::~ConfidentialTxOutReference(&local_9d0);
    }
  }
  else {
    testing::Message::Message(&local_9d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x292,
               "Expected: (txout_ref = tx.GetTxOut(index)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,&local_9d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
    testing::Message::~Message(&local_9d8);
  }
  cfd::core::ConfidentialTxOutReference::GetAsset
            (&local_a38,(ConfidentialTxOutReference *)local_210);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_9f0,"txout_ref.GetAsset().GetHex().c_str()",
             "\"6f1a4b6bd5571b5f08ab79c314dc6483f9b952af2f5ef206cd6f8e68eb1186f3\"",pcVar2,
             "6f1a4b6bd5571b5f08ab79c314dc6483f9b952af2f5ef206cd6f8e68eb1186f3");
  std::__cxx11::string::~string(local_a10);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId(&local_a38);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9f0);
  if (!bVar1) {
    testing::Message::Message(&local_a40);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_9f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x295,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,&local_a40);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
    testing::Message::~Message(&local_a40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_9f0);
  cfd::core::ConfidentialTxOutReference::GetConfidentialValue
            (&local_aa0,(ConfidentialTxOutReference *)local_210);
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_();
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_a58,"txout_ref.GetConfidentialValue().GetHex().c_str()",
             "\"010000000000bc614e\"",pcVar2,"010000000000bc614e");
  std::__cxx11::string::~string(local_a78);
  cfd::core::ConfidentialValue::~ConfidentialValue(&local_aa0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a58);
  if (!bVar1) {
    testing::Message::Message(&local_aa8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a58);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x297,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,&local_aa8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
    testing::Message::~Message(&local_aa8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a58);
  cfd::core::AbstractTxOutReference::GetLockingScript
            (&local_b18,(AbstractTxOutReference *)local_210);
  cfd::core::Script::GetHex_abi_cxx11_();
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cfd::core::Script::GetHex_abi_cxx11_();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_ac0,"txout_ref.GetLockingScript().GetHex().c_str()",
             "exp_locking_script2.GetHex().c_str()",pcVar2,pcVar3);
  std::__cxx11::string::~string(local_b38);
  std::__cxx11::string::~string(local_ae0);
  cfd::core::Script::~Script(&local_b18);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ac0);
  if (!bVar1) {
    testing::Message::Message(&local_b40);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_ac0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x299,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15.message_,&local_b40);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
    testing::Message::~Message(&local_b40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ac0);
  cfd::core::ConfidentialTxOutReference::GetNonce
            (&local_ba0,(ConfidentialTxOutReference *)local_210);
  cfd::core::ConfidentialNonce::GetHex_abi_cxx11_();
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_b58,"txout_ref.GetNonce().GetHex().c_str()",
             "\"01991a4b6bd5571b5f08ab79c314dc6483f9b952af2f5ef206cd6f8e68eb1186f3\"",pcVar2,
             "01991a4b6bd5571b5f08ab79c314dc6483f9b952af2f5ef206cd6f8e68eb1186f3");
  std::__cxx11::string::~string(local_b78);
  cfd::core::ConfidentialNonce::~ConfidentialNonce(&local_ba0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b58);
  if (!bVar1) {
    testing::Message::Message(&local_ba8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b58);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_16.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x29c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_16.message_,&local_ba8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_16.message_);
    testing::Message::~Message(&local_ba8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b58);
  cfd::core::ConfidentialTxOutReference::GetSurjectionProof
            (&local_bf8,(ConfidentialTxOutReference *)local_210);
  cfd::core::ByteData::GetHex_abi_cxx11_();
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cfd::core::ByteData::GetHex_abi_cxx11_();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_bc0,"txout_ref.GetSurjectionProof().GetHex().c_str()",
             "surjection_proof.GetHex().c_str()",pcVar2,pcVar3);
  std::__cxx11::string::~string(local_c18);
  std::__cxx11::string::~string(local_be0);
  cfd::core::ByteData::~ByteData(&local_bf8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_bc0);
  if (!bVar1) {
    testing::Message::Message(&local_c20);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_bc0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_17.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x29e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_17.message_,&local_c20);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17.message_);
    testing::Message::~Message(&local_c20);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_bc0);
  cfd::core::ConfidentialTxOutReference::GetRangeProof
            (&local_c70,(ConfidentialTxOutReference *)local_210);
  cfd::core::ByteData::GetHex_abi_cxx11_();
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cfd::core::ByteData::GetHex_abi_cxx11_();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_c38,"txout_ref.GetRangeProof().GetHex().c_str()",
             "range_proof.GetHex().c_str()",pcVar2,pcVar3);
  std::__cxx11::string::~string(local_c90);
  std::__cxx11::string::~string(local_c58);
  cfd::core::ByteData::~ByteData(&local_c70);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c38);
  if (!bVar1) {
    testing::Message::Message(&local_c98);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c38);
    testing::internal::AssertHelper::AssertHelper
              (&local_ca0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x2a0,pcVar2);
    testing::internal::AssertHelper::operator=(&local_ca0,&local_c98);
    testing::internal::AssertHelper::~AssertHelper(&local_ca0);
    testing::Message::~Message(&local_c98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c38);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_58 = cfd::core::ConfidentialTransaction::GetTxOutIndex((Script *)&get_index);
    }
  }
  else {
    testing::Message::Message(&local_ca8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_18.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x2a1,
               "Expected: get_index = tx.GetTxOutIndex(exp_locking_script2) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_18.message_,&local_ca8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_18.message_);
    testing::Message::~Message(&local_ca8);
  }
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
            ((EqHelper<false> *)local_cc0,"index","get_index",&local_54,&local_58);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_cc0);
  if (!bVar1) {
    testing::Message::Message(&local_cc8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_cc0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &txout_list.
                super__Vector_base<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x2a2,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &txout_list.
                super__Vector_base<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_cc8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &txout_list.
                super__Vector_base<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_cc8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_cc0);
  std::
  vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
  ::vector((vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
            *)local_ce8);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ConfidentialTransaction::GetTxOutList();
      std::
      vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
      ::operator=((vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
                   *)local_ce8,&local_d00);
      std::
      vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
      ::~vector(&local_d00);
    }
  }
  else {
    testing::Message::Message(&local_d08);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_19.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x2a6,
               "Expected: (txout_list = tx.GetTxOutList()) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_19.message_,&local_d08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_19.message_);
    testing::Message::~Message(&local_d08);
  }
  local_d28 = std::
              vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
              ::size((vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
                      *)local_ce8);
  local_d2c = 2;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            ((EqHelper<false> *)local_d20,"txout_list.size()","2",&local_d28,&local_d2c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d20);
  if (!bVar1) {
    testing::Message::Message(&local_d38);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_20.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x2a7,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_20.message_,&local_d38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_20.message_);
    testing::Message::~Message(&local_d38);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d20);
  pvVar4 = std::
           vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
           ::operator[]((vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
                         *)local_ce8,0);
  cfd::core::ConfidentialTxOutReference::operator=((ConfidentialTxOutReference *)local_210,pvVar4);
  cfd::core::ConfidentialTxOutReference::GetAsset
            (&local_d98,(ConfidentialTxOutReference *)local_210);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_d50,"txout_ref.GetAsset().GetHex().c_str()",
             "\"6f1a4b6bd5571b5f08ab79c314dc6483f9b952af2f5ef206cd6f8e68eb1186f3\"",pcVar2,
             "6f1a4b6bd5571b5f08ab79c314dc6483f9b952af2f5ef206cd6f8e68eb1186f3");
  std::__cxx11::string::~string(local_d70);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId(&local_d98);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d50);
  if (!bVar1) {
    testing::Message::Message(&local_da0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d50);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_21.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x2ab,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_21.message_,&local_da0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_21.message_);
    testing::Message::~Message(&local_da0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d50);
  cfd::core::ConfidentialTxOutReference::GetConfidentialValue
            (&local_e00,(ConfidentialTxOutReference *)local_210);
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_();
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_db8,"txout_ref.GetConfidentialValue().GetHex().c_str()",
             "\"010000000000bc614e\"",pcVar2,"010000000000bc614e");
  std::__cxx11::string::~string(local_dd8);
  cfd::core::ConfidentialValue::~ConfidentialValue(&local_e00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_db8);
  if (!bVar1) {
    testing::Message::Message(&local_e08);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_db8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_22.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x2ad,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_22.message_,&local_e08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_22.message_);
    testing::Message::~Message(&local_e08);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_db8);
  cfd::core::AbstractTxOutReference::GetLockingScript
            (&local_e78,(AbstractTxOutReference *)local_210);
  cfd::core::Script::GetHex_abi_cxx11_();
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cfd::core::Script::GetHex_abi_cxx11_();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_e20,"txout_ref.GetLockingScript().GetHex().c_str()",
             "exp_locking_script.GetHex().c_str()",pcVar2,pcVar3);
  std::__cxx11::string::~string(local_e98);
  std::__cxx11::string::~string(local_e40);
  cfd::core::Script::~Script(&local_e78);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e20);
  if (!bVar1) {
    testing::Message::Message(&local_ea0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_23.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x2af,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_23.message_,&local_ea0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_23.message_);
    testing::Message::~Message(&local_ea0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e20);
  cfd::core::ConfidentialTxOutReference::GetNonce
            (&local_f00,(ConfidentialTxOutReference *)local_210);
  cfd::core::ConfidentialNonce::GetHex_abi_cxx11_();
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_eb8,"txout_ref.GetNonce().GetHex().c_str()","\"\"",pcVar2,"");
  std::__cxx11::string::~string(local_ed8);
  cfd::core::ConfidentialNonce::~ConfidentialNonce(&local_f00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_eb8);
  if (!bVar1) {
    testing::Message::Message(&local_f08);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_eb8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_24.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x2b0,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_24.message_,&local_f08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_24.message_);
    testing::Message::~Message(&local_f08);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_eb8);
  cfd::core::ConfidentialTxOutReference::GetSurjectionProof
            (&local_f58,(ConfidentialTxOutReference *)local_210);
  cfd::core::ByteData::GetHex_abi_cxx11_();
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_f20,"txout_ref.GetSurjectionProof().GetHex().c_str()","\"\"",pcVar2,
             "");
  std::__cxx11::string::~string(local_f40);
  cfd::core::ByteData::~ByteData(&local_f58);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f20);
  if (!bVar1) {
    testing::Message::Message(&local_f60);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_25.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x2b1,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_25.message_,&local_f60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_25.message_);
    testing::Message::~Message(&local_f60);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f20);
  cfd::core::ConfidentialTxOutReference::GetRangeProof
            (&local_fb0,(ConfidentialTxOutReference *)local_210);
  cfd::core::ByteData::GetHex_abi_cxx11_();
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_f78,"txout_ref.GetRangeProof().GetHex().c_str()","\"\"",pcVar2,"");
  std::__cxx11::string::~string(local_f98);
  cfd::core::ByteData::~ByteData(&local_fb0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f78);
  if (!bVar1) {
    testing::Message::Message(&local_fb8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f78);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_26.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x2b2,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_26.message_,&local_fb8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_26.message_);
    testing::Message::~Message(&local_fb8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f78);
  pvVar4 = std::
           vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
           ::operator[]((vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
                         *)local_ce8,1);
  cfd::core::ConfidentialTxOutReference::operator=((ConfidentialTxOutReference *)local_210,pvVar4);
  cfd::core::ConfidentialTxOutReference::GetAsset
            (&local_1018,(ConfidentialTxOutReference *)local_210);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_fd0,"txout_ref.GetAsset().GetHex().c_str()",
             "\"6f1a4b6bd5571b5f08ab79c314dc6483f9b952af2f5ef206cd6f8e68eb1186f3\"",pcVar2,
             "6f1a4b6bd5571b5f08ab79c314dc6483f9b952af2f5ef206cd6f8e68eb1186f3");
  std::__cxx11::string::~string(local_ff0);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId(&local_1018);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_fd0);
  if (!bVar1) {
    testing::Message::Message(&local_1020);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_fd0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_27.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x2b7,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_27.message_,&local_1020);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_27.message_);
    testing::Message::~Message(&local_1020);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_fd0);
  cfd::core::ConfidentialTxOutReference::GetConfidentialValue
            (&local_1080,(ConfidentialTxOutReference *)local_210);
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_();
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_1038,"txout_ref.GetConfidentialValue().GetHex().c_str()",
             "\"010000000000bc614e\"",pcVar2,"010000000000bc614e");
  std::__cxx11::string::~string(local_1058);
  cfd::core::ConfidentialValue::~ConfidentialValue(&local_1080);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1038);
  if (!bVar1) {
    testing::Message::Message(&local_1088);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1038);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_28.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x2b9,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_28.message_,&local_1088);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_28.message_);
    testing::Message::~Message(&local_1088);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1038);
  cfd::core::AbstractTxOutReference::GetLockingScript
            (&local_10f8,(AbstractTxOutReference *)local_210);
  cfd::core::Script::GetHex_abi_cxx11_();
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cfd::core::Script::GetHex_abi_cxx11_();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_10a0,"txout_ref.GetLockingScript().GetHex().c_str()",
             "exp_locking_script2.GetHex().c_str()",pcVar2,pcVar3);
  std::__cxx11::string::~string(local_1118);
  std::__cxx11::string::~string(local_10c0);
  cfd::core::Script::~Script(&local_10f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_10a0);
  if (!bVar1) {
    testing::Message::Message(&local_1120);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_10a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_29.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,699,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_29.message_,&local_1120);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_29.message_);
    testing::Message::~Message(&local_1120);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_10a0);
  cfd::core::ConfidentialTxOutReference::GetNonce
            (&local_1180,(ConfidentialTxOutReference *)local_210);
  cfd::core::ConfidentialNonce::GetHex_abi_cxx11_();
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_1138,"txout_ref.GetNonce().GetHex().c_str()",
             "\"01991a4b6bd5571b5f08ab79c314dc6483f9b952af2f5ef206cd6f8e68eb1186f3\"",pcVar2,
             "01991a4b6bd5571b5f08ab79c314dc6483f9b952af2f5ef206cd6f8e68eb1186f3");
  std::__cxx11::string::~string(local_1158);
  cfd::core::ConfidentialNonce::~ConfidentialNonce(&local_1180);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1138);
  if (!bVar1) {
    testing::Message::Message(&local_1188);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1138);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_30.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x2be,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_30.message_,&local_1188);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_30.message_);
    testing::Message::~Message(&local_1188);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1138);
  cfd::core::ConfidentialTxOutReference::GetSurjectionProof
            (&local_11d8,(ConfidentialTxOutReference *)local_210);
  cfd::core::ByteData::GetHex_abi_cxx11_();
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cfd::core::ByteData::GetHex_abi_cxx11_();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_11a0,"txout_ref.GetSurjectionProof().GetHex().c_str()",
             "surjection_proof.GetHex().c_str()",pcVar2,pcVar3);
  std::__cxx11::string::~string(local_11f8);
  std::__cxx11::string::~string(local_11c0);
  cfd::core::ByteData::~ByteData(&local_11d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_11a0);
  if (!bVar1) {
    testing::Message::Message(&local_1200);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_11a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_31.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x2c0,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_31.message_,&local_1200);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_31.message_);
    testing::Message::~Message(&local_1200);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_11a0);
  cfd::core::ConfidentialTxOutReference::GetRangeProof
            (&local_1250,(ConfidentialTxOutReference *)local_210);
  cfd::core::ByteData::GetHex_abi_cxx11_();
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cfd::core::ByteData::GetHex_abi_cxx11_();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_1218,"txout_ref.GetRangeProof().GetHex().c_str()",
             "range_proof.GetHex().c_str()",pcVar2,pcVar3);
  std::__cxx11::string::~string(local_1270);
  std::__cxx11::string::~string(local_1238);
  cfd::core::ByteData::~ByteData(&local_1250);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1218);
  if (!bVar1) {
    testing::Message::Message(&local_1278);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1218);
    testing::internal::AssertHelper::AssertHelper
              (&local_1280,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x2c2,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1280,&local_1278);
    testing::internal::AssertHelper::~AssertHelper(&local_1280);
    testing::Message::~Message(&local_1278);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1218);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_54 = cfd::core::ConfidentialTransaction::AddTxOut
                           ((Amount *)&get_index,(ConfidentialAssetId *)local_e0,
                            (Script *)
                            &txout_ref.range_proof_.data_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
    }
  }
  else {
    testing::Message::Message(&local_1288);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_32.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x2c5,
               "Expected: (index = tx.AddTxOut(amt, asset, exp_locking_script)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_32.message_,&local_1288);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_32.message_);
    testing::Message::~Message(&local_1288);
  }
  local_12a4 = 2;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            ((EqHelper<false> *)local_12a0,"index","2",&local_54,&local_12a4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_12a0);
  if (!bVar1) {
    testing::Message::Message(&local_12b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_12a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_33.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x2c6,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_33.message_,&local_12b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_33.message_);
    testing::Message::~Message(&local_12b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_12a0);
  local_12cc = cfd::core::ConfidentialTransaction::GetTxOutCount();
  local_12d0 = 3;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            ((EqHelper<false> *)local_12c8,"tx.GetTxOutCount()","3",&local_12cc,&local_12d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_12c8);
  if (!bVar1) {
    testing::Message::Message(&local_12d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_12c8);
    testing::internal::AssertHelper::AssertHelper
              (&local_12e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x2c7,pcVar2);
    testing::internal::AssertHelper::operator=(&local_12e0,&local_12d8);
    testing::internal::AssertHelper::~AssertHelper(&local_12e0);
    testing::Message::~Message(&local_12d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_12c8);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_58 = cfd::core::ConfidentialTransaction::GetTxOutIndex((Script *)&get_index);
    }
  }
  else {
    testing::Message::Message(&local_12e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_34.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x2c8,
               "Expected: get_index = tx.GetTxOutIndex(exp_locking_script) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_34.message_,&local_12e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_34.message_);
    testing::Message::~Message(&local_12e8);
  }
  local_1304 = 0;
  testing::internal::EqHelper<true>::Compare<int,unsigned_int>
            (local_1300,"0",(int *)"get_index",&local_1304,&local_58);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1300);
  if (!bVar1) {
    testing::Message::Message(&local_1310);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1300);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &index_list.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x2c9,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &index_list.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_1310);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &index_list.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_1310);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1300);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&stack0xffffffffffffecd0);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ConfidentialTransaction::GetTxOutIndexList((Script *)&stack0xffffffffffffecb8);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&stack0xffffffffffffecd0,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&stack0xffffffffffffecb8);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&stack0xffffffffffffecb8);
    }
  }
  else {
    testing::Message::Message(&local_1350);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_35.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x2cb,
               "Expected: index_list = tx.GetTxOutIndexList(exp_locking_script) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_35.message_,&local_1350);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_35.message_);
    testing::Message::~Message(&local_1350);
  }
  local_136c = 2;
  local_1378 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                          &stack0xffffffffffffecd0);
  testing::internal::EqHelper<false>::Compare<int,unsigned_long>
            ((EqHelper<false> *)local_1368,"2","index_list.size()",&local_136c,&local_1378);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1368);
  if (!bVar1) {
    testing::Message::Message(&local_1380);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1368);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_36.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x2cc,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_36.message_,&local_1380);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_36.message_);
    testing::Message::~Message(&local_1380);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1368);
  sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&stack0xffffffffffffecd0
                    );
  if (sVar5 == 2) {
    local_139c = 0;
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                        &stack0xffffffffffffecd0,0);
    testing::internal::EqHelper<true>::Compare<int,unsigned_int>
              (local_1398,"0",(int *)"index_list[0]",&local_139c,pvVar6);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1398);
    if (!bVar1) {
      testing::Message::Message(&local_13a8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1398);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_37.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
                 ,0x2ce,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_37.message_,&local_13a8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_37.message_);
      testing::Message::~Message(&local_13a8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1398);
    local_13c4 = 2;
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                        &stack0xffffffffffffecd0,1);
    testing::internal::EqHelper<false>::Compare<int,unsigned_int>
              ((EqHelper<false> *)local_13c0,"2","index_list[1]",&local_13c4,pvVar6);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_13c0);
    if (!bVar1) {
      testing::Message::Message(&local_13d0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_13c0);
      testing::internal::AssertHelper::AssertHelper
                (&local_13d8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
                 ,0x2cf,pcVar2);
      testing::internal::AssertHelper::operator=(&local_13d8,&local_13d0);
      testing::internal::AssertHelper::~AssertHelper(&local_13d8);
      testing::Message::~Message(&local_13d0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_13c0);
  }
  local_13f8 = cfd::core::Amount::CreateBySatoshiAmount(0x74cbb1);
  local_13f0 = extraout_DL_00;
  local_13e8 = local_13f8;
  amt2 = extraout_DL_00;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ConfidentialTransaction::SetTxOutValue((uint)&get_index,(Amount *)0x2);
    }
  }
  else {
    testing::Message::Message(&local_1400);
    testing::internal::AssertHelper::AssertHelper
              (&local_1408,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x2d4,
               "Expected: tx.SetTxOutValue(2, amt2) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_1408,&local_1400);
    testing::internal::AssertHelper::~AssertHelper(&local_1408);
    testing::Message::~Message(&local_1400);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ConfidentialTransaction::GetTxOut((uint)&local_1500);
      cfd::core::ConfidentialTxOutReference::operator=
                ((ConfidentialTxOutReference *)local_210,&local_1500);
      cfd::core::ConfidentialTxOutReference::~ConfidentialTxOutReference(&local_1500);
    }
  }
  else {
    testing::Message::Message(&local_1508);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_38.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x2d5,
               "Expected: (txout_ref = tx.GetTxOut(2)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_38.message_,&local_1508);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_38.message_);
    testing::Message::~Message(&local_1508);
  }
  cfd::core::ConfidentialTxOutReference::GetConfidentialValue
            (&local_1568,(ConfidentialTxOutReference *)local_210);
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_();
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_1520,"txout_ref.GetConfidentialValue().GetHex().c_str()",
             "\"01000000000074cbb1\"",pcVar2,"01000000000074cbb1");
  std::__cxx11::string::~string(local_1540);
  cfd::core::ConfidentialValue::~ConfidentialValue(&local_1568);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1520);
  if (!bVar1) {
    testing::Message::Message(&local_1570);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1520);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_msg_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x2d7,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_msg_2,&local_1570);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_msg_2);
    testing::Message::~Message(&local_1570);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1520);
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xffffffffffffea80,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xffffffffffffea80);
  if (bVar1) {
    anon_var_0_2._7_1_ = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ConfidentialTransaction::RemoveTxOut((uint)&get_index);
    }
    if ((anon_var_0_2._7_1_ & 1) != 0) goto LAB_0044a853;
    pcStack_1580 = 
    "Expected: (tx.RemoveTxOut(3)) throws an exception of type CfdException.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_1598);
  testing::internal::AssertHelper::AssertHelper
            (&local_15a0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
             ,0x2da,pcStack_1580);
  testing::internal::AssertHelper::operator=(&local_15a0,local_1598);
  testing::internal::AssertHelper::~AssertHelper(&local_15a0);
  testing::Message::~Message(local_1598);
LAB_0044a853:
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ConfidentialTransaction::RemoveTxOut((uint)&get_index);
    }
  }
  else {
    testing::Message::Message(&local_15a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_39.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x2db,
               "Expected: (tx.RemoveTxOut(0)) doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_39.message_,&local_15a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_39.message_);
    testing::Message::~Message(&local_15a8);
  }
  local_15c4 = cfd::core::ConfidentialTransaction::GetTxOutCount();
  local_15c8 = 2;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            ((EqHelper<false> *)local_15c0,"tx.GetTxOutCount()","2",&local_15c4,&local_15c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_15c0);
  if (!bVar1) {
    testing::Message::Message(&local_15d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_15c0);
    testing::internal::AssertHelper::AssertHelper
              (&local_15d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x2dc,pcVar2);
    testing::internal::AssertHelper::operator=(&local_15d8,&local_15d0);
    testing::internal::AssertHelper::~AssertHelper(&local_15d8);
    testing::Message::~Message(&local_15d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_15c0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&stack0xffffffffffffecd0);
  std::
  vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
  ::~vector((vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
             *)local_ce8);
  cfd::core::ByteData::~ByteData((ByteData *)local_850);
  cfd::core::ByteData::~ByteData((ByteData *)local_810);
  cfd::core::ConfidentialNonce::~ConfidentialNonce((ConfidentialNonce *)local_7d0);
  cfd::core::Script::~Script((Script *)local_780);
  cfd::core::ConfidentialTxOutReference::~ConfidentialTxOutReference
            ((ConfidentialTxOutReference *)local_210);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId
            ((ConfidentialAssetId *)
             &txout_ref.range_proof_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::ConfidentialTransaction::~ConfidentialTransaction
            ((ConfidentialTransaction *)&get_index);
  return;
}

Assistant:

TEST(ConfidentialTransaction, TxOutTest) {
  ConfidentialTransaction tx(exp_tx_empty_hex);
  uint32_t index = 0;
  uint32_t get_index = 0;
  EXPECT_NO_THROW((index = tx.AddTxIn(exp_txid, exp_index, exp_sequence)));

  // AddTxOut, GetTxOut, GetTxOutCount
  EXPECT_EQ(tx.GetTxOutCount(), 0);
  int64_t exp_satoshi = 12345678;
  EXPECT_THROW((get_index = tx.GetTxOutIndex(exp_locking_script)), CfdException);

  Amount amt = Amount::CreateBySatoshiAmount(exp_satoshi);
  ConfidentialAssetId asset(exp_assetid);
  ConfidentialTxOutReference txout_ref;
  EXPECT_NO_THROW((index = tx.AddTxOut(amt, asset, exp_locking_script)));
  EXPECT_EQ(index, 0);
  EXPECT_EQ(tx.GetTxOutCount(), 1);
  EXPECT_NO_THROW(get_index = tx.GetTxOutIndex(exp_locking_script));
  EXPECT_EQ(index, get_index);

  EXPECT_THROW((txout_ref = tx.GetTxOut(index + 5)), CfdException);
  EXPECT_NO_THROW((txout_ref = tx.GetTxOut(index)));
  EXPECT_STREQ(
      txout_ref.GetAsset().GetHex().c_str(),
      "6f1a4b6bd5571b5f08ab79c314dc6483f9b952af2f5ef206cd6f8e68eb1186f3");
  EXPECT_STREQ(txout_ref.GetConfidentialValue().GetHex().c_str(),
               "010000000000bc614e");
  EXPECT_STREQ(txout_ref.GetLockingScript().GetHex().c_str(),
               exp_locking_script.GetHex().c_str());
  EXPECT_STREQ(txout_ref.GetNonce().GetHex().c_str(), "");
  EXPECT_STREQ(txout_ref.GetSurjectionProof().GetHex().c_str(), "");
  EXPECT_STREQ(txout_ref.GetRangeProof().GetHex().c_str(), "");

  // AddTxOut
  Script exp_locking_script2("00146a98a3f2935718df72518c00768ec67c589e0b28");
  ConfidentialNonce nonce(
      "991a4b6bd5571b5f08ab79c314dc6483f9b952af2f5ef206cd6f8e68eb1186f3");
  ByteData surjection_proof("1234567890");
  ByteData range_proof("1234567890123456789012345678901234567890");
  EXPECT_NO_THROW(
      (index = tx.AddTxOut(amt, asset, exp_locking_script2, nonce,
                           surjection_proof, range_proof)));
  EXPECT_EQ(index, 1);
  EXPECT_EQ(tx.GetTxOutCount(), 2);
  EXPECT_NO_THROW((txout_ref = tx.GetTxOut(index)));
  EXPECT_STREQ(
      txout_ref.GetAsset().GetHex().c_str(),
      "6f1a4b6bd5571b5f08ab79c314dc6483f9b952af2f5ef206cd6f8e68eb1186f3");
  EXPECT_STREQ(txout_ref.GetConfidentialValue().GetHex().c_str(),
               "010000000000bc614e");
  EXPECT_STREQ(txout_ref.GetLockingScript().GetHex().c_str(),
               exp_locking_script2.GetHex().c_str());
  EXPECT_STREQ(
      txout_ref.GetNonce().GetHex().c_str(),
      "01991a4b6bd5571b5f08ab79c314dc6483f9b952af2f5ef206cd6f8e68eb1186f3");
  EXPECT_STREQ(txout_ref.GetSurjectionProof().GetHex().c_str(),
               surjection_proof.GetHex().c_str());
  EXPECT_STREQ(txout_ref.GetRangeProof().GetHex().c_str(),
               range_proof.GetHex().c_str());
  EXPECT_NO_THROW(get_index = tx.GetTxOutIndex(exp_locking_script2));
  EXPECT_EQ(index, get_index);

  // GetTxOutList
  std::vector<ConfidentialTxOutReference> txout_list;
  EXPECT_NO_THROW((txout_list = tx.GetTxOutList()));
  EXPECT_EQ(txout_list.size(), 2);
  txout_ref = txout_list[0];
  EXPECT_STREQ(
      txout_ref.GetAsset().GetHex().c_str(),
      "6f1a4b6bd5571b5f08ab79c314dc6483f9b952af2f5ef206cd6f8e68eb1186f3");
  EXPECT_STREQ(txout_ref.GetConfidentialValue().GetHex().c_str(),
               "010000000000bc614e");
  EXPECT_STREQ(txout_ref.GetLockingScript().GetHex().c_str(),
               exp_locking_script.GetHex().c_str());
  EXPECT_STREQ(txout_ref.GetNonce().GetHex().c_str(), "");
  EXPECT_STREQ(txout_ref.GetSurjectionProof().GetHex().c_str(), "");
  EXPECT_STREQ(txout_ref.GetRangeProof().GetHex().c_str(), "");

  txout_ref = txout_list[1];
  EXPECT_STREQ(
      txout_ref.GetAsset().GetHex().c_str(),
      "6f1a4b6bd5571b5f08ab79c314dc6483f9b952af2f5ef206cd6f8e68eb1186f3");
  EXPECT_STREQ(txout_ref.GetConfidentialValue().GetHex().c_str(),
               "010000000000bc614e");
  EXPECT_STREQ(txout_ref.GetLockingScript().GetHex().c_str(),
               exp_locking_script2.GetHex().c_str());
  EXPECT_STREQ(
      txout_ref.GetNonce().GetHex().c_str(),
      "01991a4b6bd5571b5f08ab79c314dc6483f9b952af2f5ef206cd6f8e68eb1186f3");
  EXPECT_STREQ(txout_ref.GetSurjectionProof().GetHex().c_str(),
               surjection_proof.GetHex().c_str());
  EXPECT_STREQ(txout_ref.GetRangeProof().GetHex().c_str(),
               range_proof.GetHex().c_str());

  // AddTxOut (address duplex)
  EXPECT_NO_THROW((index = tx.AddTxOut(amt, asset, exp_locking_script)));
  EXPECT_EQ(index, 2);
  EXPECT_EQ(tx.GetTxOutCount(), 3);
  EXPECT_NO_THROW(get_index = tx.GetTxOutIndex(exp_locking_script));
  EXPECT_EQ(0, get_index);
  std::vector<uint32_t> index_list;
  EXPECT_NO_THROW(index_list = tx.GetTxOutIndexList(exp_locking_script));
  EXPECT_EQ(2, index_list.size());
  if (index_list.size() == 2) {
    EXPECT_EQ(0, index_list[0]);
    EXPECT_EQ(2, index_list[1]);
  }

  // SetTxOutValue (address duplex)
  Amount amt2 = Amount::CreateBySatoshiAmount(7654321);
  EXPECT_NO_THROW(tx.SetTxOutValue(2, amt2));
  EXPECT_NO_THROW((txout_ref = tx.GetTxOut(2)));
  EXPECT_STREQ(txout_ref.GetConfidentialValue().GetHex().c_str(),
               "01000000000074cbb1");

  // RemoveTxOut
  EXPECT_THROW((tx.RemoveTxOut(3)), CfdException);
  EXPECT_NO_THROW((tx.RemoveTxOut(0)));
  EXPECT_EQ(tx.GetTxOutCount(), 2);
}